

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_buffer.h
# Opt level: O0

void __thiscall lumeview::GLBuffer::set_sub_data(GLBuffer *this,uint offset,void *data,uint size)

{
  LumeviewError *this_00;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  uint local_24;
  void *pvStack_20;
  uint size_local;
  void *data_local;
  GLBuffer *pGStack_10;
  uint offset_local;
  GLBuffer *this_local;
  
  local_24 = size;
  pvStack_20 = data;
  data_local._4_4_ = offset;
  pGStack_10 = this;
  if (this->m_size < offset + size) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::operator<<(local_1a0,
                    "GLBuffer::set_sub_data: Specified buffer region expands over buffer boundary");
    this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringstream::str();
    LumeviewError::LumeviewError(this_00,local_1e0);
    __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
  }
  bind(this,offset,(sockaddr *)data,(socklen_t)this);
  (*glad_glBufferSubData)(this->m_type,(GLintptr)data_local._4_4_,(GLsizeiptr)local_24,pvStack_20);
  return;
}

Assistant:

void set_sub_data (const uint offset, const void* data, const uint size) {
		COND_THROW (offset + size > m_size,
		            "GLBuffer::set_sub_data: Specified buffer region expands over buffer boundary");
		bind ();
		glBufferSubData (m_type, offset, size, data);
	}